

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

void __thiscall re2c::OutputFile::~OutputFile(OutputFile *this)

{
  OutputBlock *this_00;
  size_type sVar1;
  reference ppOVar2;
  uint local_14;
  uint i;
  OutputFile *this_local;
  
  if ((this->file != (FILE *)0x0) && (this->file != _stdout)) {
    fclose((FILE *)this->file);
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::size
                      (&this->blocks);
    if (sVar1 <= local_14) break;
    ppOVar2 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::operator[]
                        (&this->blocks,(ulong)local_14);
    this_00 = *ppOVar2;
    if (this_00 != (OutputBlock *)0x0) {
      OutputBlock::~OutputBlock(this_00);
      operator_delete(this_00,0x48);
    }
    local_14 = local_14 + 1;
  }
  std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::~vector(&this->blocks);
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
	if (file != NULL && file != stdout)
	{
		fclose (file);
	}
	for (unsigned int i = 0; i < blocks.size (); ++i)
	{
		delete blocks[i];
	}
}